

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

string * __thiscall dns::Message::asString_abi_cxx11_(Message *this)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  uint *in_RSI;
  string *in_RDI;
  iterator it_3;
  iterator it_2;
  iterator it_1;
  iterator it;
  ostringstream text;
  vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_> *in_stack_fffffffffffffca8;
  ostream *in_stack_fffffffffffffcb0;
  string local_258 [32];
  ResourceRecord **local_238;
  __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
  local_230;
  string local_228 [32];
  ResourceRecord **local_208;
  __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
  local_200;
  string local_1f8 [32];
  ResourceRecord **local_1d8;
  __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
  local_1d0;
  string local_1c8 [32];
  QuerySection **local_1a8;
  __normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
  local_1a0;
  ResourceRecord *in_stack_fffffffffffffe68;
  QuerySection *in_stack_fffffffffffffe78;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe78);
  poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"Header:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"ID: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::showbase);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*in_RSI);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::noshowbase);
  poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"  fields: [ QR: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RSI[1]);
  poVar2 = std::operator<<(poVar2," opCode: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RSI[2]);
  poVar2 = std::operator<<(poVar2," ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"  QDcount: ");
  sVar3 = std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>::size
                    ((vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_> *)
                     (in_RSI + 8));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"  ANcount: ");
  sVar3 = std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::size
                    ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                     (in_RSI + 0xe));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"  NScount: ");
  sVar3 = std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::size
                    ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                     (in_RSI + 0x14));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"  ARcount: ");
  sVar3 = std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::size
                    ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                     (in_RSI + 0x1a));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>::size
                    ((vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_> *)
                     (in_RSI + 8));
  if (sVar3 != 0) {
    poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"Queries:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1a0._M_current =
         (QuerySection **)
         std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>::begin
                   (in_stack_fffffffffffffca8);
    while( true ) {
      local_1a8 = (QuerySection **)
                  std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>::end
                            (in_stack_fffffffffffffca8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
                          *)in_stack_fffffffffffffcb0,
                         (__normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
                          *)in_stack_fffffffffffffca8);
      if (!bVar1) break;
      poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"  ");
      __gnu_cxx::
      __normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
      ::operator*(&local_1a0);
      QuerySection::asString_abi_cxx11_(in_stack_fffffffffffffe78);
      std::operator<<(poVar2,local_1c8);
      std::__cxx11::string::~string(local_1c8);
      __gnu_cxx::
      __normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
      ::operator++(&local_1a0);
    }
  }
  sVar3 = std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::size
                    ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                     (in_RSI + 0xe));
  if (sVar3 != 0) {
    poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"Answers:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1d0._M_current =
         (ResourceRecord **)
         std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::begin
                   ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                    in_stack_fffffffffffffca8);
    while( true ) {
      local_1d8 = (ResourceRecord **)
                  std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::end
                            ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>
                              *)in_stack_fffffffffffffca8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                          *)in_stack_fffffffffffffcb0,
                         (__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                          *)in_stack_fffffffffffffca8);
      if (!bVar1) break;
      poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"  ");
      __gnu_cxx::
      __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
      ::operator*(&local_1d0);
      ResourceRecord::asString_abi_cxx11_(in_stack_fffffffffffffe68);
      std::operator<<(poVar2,local_1f8);
      std::__cxx11::string::~string(local_1f8);
      __gnu_cxx::
      __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
      ::operator++(&local_1d0);
    }
  }
  sVar3 = std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::size
                    ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                     (in_RSI + 0x14));
  if (sVar3 != 0) {
    poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"Authorities:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_200._M_current =
         (ResourceRecord **)
         std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::begin
                   ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                    in_stack_fffffffffffffca8);
    while( true ) {
      local_208 = (ResourceRecord **)
                  std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::end
                            ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>
                              *)in_stack_fffffffffffffca8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                          *)in_stack_fffffffffffffcb0,
                         (__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                          *)in_stack_fffffffffffffca8);
      if (!bVar1) break;
      poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"  ");
      __gnu_cxx::
      __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
      ::operator*(&local_200);
      ResourceRecord::asString_abi_cxx11_(in_stack_fffffffffffffe68);
      std::operator<<(poVar2,local_228);
      std::__cxx11::string::~string(local_228);
      __gnu_cxx::
      __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
      ::operator++(&local_200);
    }
  }
  sVar3 = std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::size
                    ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                     (in_RSI + 0x1a));
  if (sVar3 != 0) {
    poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"Additional:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_230._M_current =
         (ResourceRecord **)
         std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::begin
                   ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                    in_stack_fffffffffffffca8);
    while( true ) {
      local_238 = (ResourceRecord **)
                  std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::end
                            ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>
                              *)in_stack_fffffffffffffca8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                          *)in_stack_fffffffffffffcb0,
                         (__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                          *)in_stack_fffffffffffffca8);
      if (!bVar1) break;
      in_stack_fffffffffffffcb0 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"  ");
      __gnu_cxx::
      __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
      ::operator*(&local_230);
      ResourceRecord::asString_abi_cxx11_(in_stack_fffffffffffffe68);
      std::operator<<(in_stack_fffffffffffffcb0,local_258);
      std::__cxx11::string::~string(local_258);
      __gnu_cxx::
      __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
      ::operator++(&local_230);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe78);
  return in_RDI;
}

Assistant:

string Message::asString()
{
    ostringstream text;
    text << "Header:" << endl;
    text << "ID: " << showbase << hex << mId << endl << noshowbase;
    text << "  fields: [ QR: " << mQr << " opCode: " << mOpCode << " ]" << endl;
    text << "  QDcount: " << mQueries.size() << endl;
    text << "  ANcount: " << mAnswers.size() << endl;
    text << "  NScount: " << mAuthorities.size() << endl;
    text << "  ARcount: " << mAdditional.size() << endl;

    if (mQueries.size() > 0)
    {
        text << "Queries:" << endl;
        for(std::vector<QuerySection*>::iterator it = mQueries.begin(); it != mQueries.end(); ++it)
            text << "  " << (*it)->asString();
    }

    if (mAnswers.size() > 0)
    {
        text << "Answers:" << endl;
        for(std::vector<ResourceRecord*>::iterator it = mAnswers.begin(); it != mAnswers.end(); ++it)
            text << "  " << (*it)->asString();
    }

    if (mAuthorities.size() > 0)
    {
        text << "Authorities:" << endl;
        for(std::vector<ResourceRecord*>::iterator it = mAuthorities.begin(); it != mAuthorities.end(); ++it)
            text << "  " << (*it)->asString();
    }

    if (mAdditional.size() > 0)
    {
        text << "Additional:" << endl;
        for(std::vector<ResourceRecord*>::iterator it = mAdditional.begin(); it != mAdditional.end(); ++it)
            text << "  " << (*it)->asString();
    }


    return text.str();
}